

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::ConvertToSampledImagePass::IsSamplerOfSampledImageDecoratedByDescriptorSetBinding
          (ConvertToSampledImagePass *this,Instruction *sampled_image_inst,
          DescriptorSetAndBinding *descriptor_set_binding)

{
  IRContext *this_00;
  DefUseManager *this_01;
  bool bVar1;
  uint32_t uVar2;
  DescriptorSetAndBinding in_RAX;
  Instruction *pIVar3;
  undefined7 extraout_var;
  uint uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  DescriptorSetAndBinding sampler_descriptor_set_binding;
  DescriptorSetAndBinding local_28;
  
  this_00 = (this->super_Pass).context_;
  local_28 = in_RAX;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  this_01 = (this_00->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar4 = (sampled_image_inst->has_result_id_ & 1) + 1;
  if (sampled_image_inst->has_type_id_ == false) {
    uVar4 = (uint)sampled_image_inst->has_result_id_;
  }
  uVar2 = Instruction::GetSingleWordOperand(sampled_image_inst,uVar4 + 1);
  pIVar3 = analysis::DefUseManager::GetDef(this_01,uVar2);
  if (pIVar3->opcode_ == OpLoad) {
    uVar2 = (pIVar3->has_result_id_ & 1) + 1;
    if (pIVar3->has_type_id_ == false) {
      uVar2 = (uint)pIVar3->has_result_id_;
    }
    uVar2 = Instruction::GetSingleWordOperand(pIVar3,uVar2);
    pIVar3 = analysis::DefUseManager::GetDef(this_01,uVar2);
    bVar1 = GetDescriptorSetBinding(this,pIVar3,&local_28);
    if (bVar1) {
      iVar6 = -(uint)(local_28.descriptor_set == (*descriptor_set_binding).descriptor_set);
      iVar7 = -(uint)(local_28.binding == (*descriptor_set_binding).binding);
      auVar5._4_4_ = iVar6;
      auVar5._0_4_ = iVar6;
      auVar5._8_4_ = iVar7;
      auVar5._12_4_ = iVar7;
      iVar6 = movmskpd((int)CONCAT71(extraout_var,bVar1),auVar5);
      return iVar6 == 3;
    }
  }
  return false;
}

Assistant:

bool ConvertToSampledImagePass::
    IsSamplerOfSampledImageDecoratedByDescriptorSetBinding(
        Instruction* sampled_image_inst,
        const DescriptorSetAndBinding& descriptor_set_binding) {
  auto* def_use_mgr = context()->get_def_use_mgr();
  uint32_t sampler_id = sampled_image_inst->GetSingleWordInOperand(1u);
  auto* sampler_load = def_use_mgr->GetDef(sampler_id);
  if (sampler_load->opcode() != spv::Op::OpLoad) return false;
  auto* sampler = def_use_mgr->GetDef(sampler_load->GetSingleWordInOperand(0u));
  DescriptorSetAndBinding sampler_descriptor_set_binding;
  return GetDescriptorSetBinding(*sampler, &sampler_descriptor_set_binding) &&
         sampler_descriptor_set_binding == descriptor_set_binding;
}